

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

RefAST __thiscall antlr::ASTFactory::dupTree(ASTFactory *this,RefAST *t)

{
  long *plVar1;
  long *in_RDX;
  _func_int *p_Var2;
  ASTRefCount<antlr::AST> AStack_38;
  ASTRefCount<antlr::AST> local_30;
  ASTRefCount<antlr::AST> local_28;
  
  local_28.ref = (ASTRef *)*in_RDX;
  if (local_28.ref != (ASTRef *)0x0) {
    (local_28.ref)->count = (local_28.ref)->count + 1;
  }
  dup(this,(int)t);
  ASTRefCount<antlr::AST>::~ASTRefCount(&local_28);
  if (((long *)*in_RDX != (long *)0x0) && (plVar1 = *(long **)*in_RDX, plVar1 != (long *)0x0)) {
    if (this->_vptr_ASTFactory == (_func_int **)0x0) {
      p_Var2 = (_func_int *)0x0;
    }
    else {
      p_Var2 = *this->_vptr_ASTFactory;
    }
    (**(code **)(*plVar1 + 0x68))(&AStack_38);
    dupList((ASTFactory *)&local_30,t);
    (**(code **)(*(long *)p_Var2 + 0xa0))(p_Var2,&local_30);
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_30);
    ASTRefCount<antlr::AST>::~ASTRefCount(&AStack_38);
  }
  return (RefAST)(ASTRef *)this;
}

Assistant:

RefAST ASTFactory::dupTree(RefAST t)
{
	RefAST result = dup(t);		// make copy of root
	// copy all children of root.
	if( t )
		result->setFirstChild( dupList(t->getFirstChild()) );
	return result;
}